

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O1

ncnn_allocator_t ncnn_allocator_create_pool_allocator(void)

{
  ncnn_allocator_t p_Var1;
  PoolAllocator *this;
  
  p_Var1 = (ncnn_allocator_t)malloc(0x18);
  this = (PoolAllocator *)operator_new(0x18);
  ncnn::PoolAllocator::PoolAllocator(this);
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__PoolAllocator_003534d0;
  this[1].super_Allocator._vptr_Allocator = (_func_int **)p_Var1;
  p_Var1->pthis = this;
  p_Var1->fast_malloc = __ncnn_PoolAllocator_fast_malloc;
  p_Var1->fast_free = __ncnn_PoolAllocator_fast_free;
  return p_Var1;
}

Assistant:

ncnn_allocator_t ncnn_allocator_create_pool_allocator()
{
    ncnn_allocator_t allocator = (ncnn_allocator_t)malloc(sizeof(struct __ncnn_allocator_t));
    allocator->pthis = (void*)(new PoolAllocator_c_api(allocator));
    allocator->fast_malloc = __ncnn_PoolAllocator_fast_malloc;
    allocator->fast_free = __ncnn_PoolAllocator_fast_free;
    return allocator;
}